

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionObject.cpp
# Opt level: O0

bool __thiscall SessionObject::deleteAttribute(SessionObject *this,CK_ATTRIBUTE_TYPE type)

{
  mapped_type *ppOVar1;
  key_type *in_RSI;
  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  *in_RDI;
  MutexLocker lock;
  Mutex *in_stack_ffffffffffffffa8;
  mapped_type __x;
  MutexLocker *in_stack_ffffffffffffffb0;
  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  *this_00;
  bool local_1;
  
  this_00 = in_RDI;
  MutexLocker::MutexLocker(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if ((in_RDI[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_color & _S_black) == _S_red) {
    softHSMLog(7,"deleteAttribute",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/SessionObject.cpp"
               ,0xc9,"Cannot update invalid session object 0x%08X",in_RDI);
    local_1 = false;
  }
  else {
    ppOVar1 = std::
              map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
              ::operator[](this_00,in_RSI);
    if (*ppOVar1 == (mapped_type)0x0) {
      softHSMLog(7,"deleteAttribute",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/SessionObject.cpp"
                 ,0xd0,"Cannot delete attribute that doesn\'t exist in object 0x%08X",in_RDI);
      local_1 = false;
    }
    else {
      in_stack_ffffffffffffffb0 =
           (MutexLocker *)
           std::
           map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
           ::operator[](this_00,in_RSI);
      __x = *(mapped_type *)&((_Rep_type *)&in_stack_ffffffffffffffb0->_vptr_MutexLocker)->_M_impl;
      if (__x != (mapped_type)0x0) {
        (*__x->_vptr_OSAttribute[1])();
      }
      std::
      map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
      ::erase((map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
               *)in_stack_ffffffffffffffb0,(key_type *)__x);
      local_1 = true;
    }
  }
  MutexLocker::~MutexLocker(in_stack_ffffffffffffffb0);
  return local_1;
}

Assistant:

bool SessionObject::deleteAttribute(CK_ATTRIBUTE_TYPE type)
{
	MutexLocker lock(objectMutex);

	if (!valid)
	{
		DEBUG_MSG("Cannot update invalid session object 0x%08X", this);

		return false;
	}

	if (attributes[type] == NULL)
	{
		DEBUG_MSG("Cannot delete attribute that doesn't exist in object 0x%08X", this);

		return false;
	}

	delete attributes[type];
	attributes.erase(type);

	return true;
}